

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O3

void wallet::ErrorLogCallback(void *arg,int code,char *msg)

{
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  char *msg_local;
  int code_local;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  msg_local = msg;
  code_local = code;
  if (arg != (void *)0x0) {
    __assert_fail("arg == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
                  ,0x2a,"void wallet::ErrorLogCallback(void *, int, const char *)");
  }
  logging_function._M_str = "ErrorLogCallback";
  logging_function._M_len = 0x10;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
  ;
  source_file._M_len = 0x61;
  LogPrintFormatInternal<int,char_const*>
            (logging_function,source_file,0x2b,ALL,Info,(ConstevalFormatString<2U>)0x49d467,
             &code_local,&msg_local);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void ErrorLogCallback(void* arg, int code, const char* msg)
{
    // From sqlite3_config() documentation for the SQLITE_CONFIG_LOG option:
    // "The void pointer that is the second argument to SQLITE_CONFIG_LOG is passed through as
    // the first parameter to the application-defined logger function whenever that function is
    // invoked."
    // Assert that this is the case:
    assert(arg == nullptr);
    LogPrintf("SQLite Error. Code: %d. Message: %s\n", code, msg);
}